

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

Float __thiscall
pbrt::RealisticCamera::TraceLensesFromFilm(RealisticCamera *this,Ray *rCamera,Ray *rOut)

{
  LensElementInterface *pLVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  Float FVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar12 [56];
  undefined1 auVar11 [64];
  float fVar13;
  undefined1 auVar14 [16];
  Point3f PVar15;
  Vector3<float> VVar16;
  Float t;
  float local_e4;
  Vector3f local_e0;
  Ray local_d0;
  undefined1 local_a8 [16];
  Tuple3<pbrt::Normal3,_float> local_90;
  Ray *local_80;
  Image *local_78;
  Tuple3<pbrt::Vector3,_float> local_70;
  Tuple3<pbrt::Vector3,_float> local_60;
  WrapMode2D local_50;
  undefined1 local_48 [16];
  
  local_d0.o.super_Tuple3<pbrt::Point3,_float>.x = (rCamera->o).super_Tuple3<pbrt::Point3,_float>.x;
  local_d0.o.super_Tuple3<pbrt::Point3,_float>.y = (rCamera->o).super_Tuple3<pbrt::Point3,_float>.y;
  local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z =
       -(rCamera->d).super_Tuple3<pbrt::Vector3,_float>.z;
  local_d0.time = rCamera->time;
  local_d0.d.super_Tuple3<pbrt::Vector3,_float>.x =
       (rCamera->d).super_Tuple3<pbrt::Vector3,_float>.x;
  local_d0.d.super_Tuple3<pbrt::Vector3,_float>.y =
       (rCamera->d).super_Tuple3<pbrt::Vector3,_float>.y;
  local_d0.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  local_78 = &this->apertureImage;
  local_a8._0_4_ = 0x3f800000;
  local_e4 = 0.0;
  uVar2 = (uint)(this->elementInterfaces).nStored;
  local_d0.o.super_Tuple3<pbrt::Point3,_float>.z = -(rCamera->o).super_Tuple3<pbrt::Point3,_float>.z
  ;
  local_80 = rOut;
  while( true ) {
    do {
      while( true ) {
        uVar4 = uVar2;
        uVar2 = uVar4 - 1;
        if ((int)uVar2 < 0) {
          if (local_80 != (Ray *)0x0) {
            (local_80->o).super_Tuple3<pbrt::Point3,_float>.x =
                 local_d0.o.super_Tuple3<pbrt::Point3,_float>.x;
            (local_80->o).super_Tuple3<pbrt::Point3,_float>.y =
                 local_d0.o.super_Tuple3<pbrt::Point3,_float>.y;
            (local_80->o).super_Tuple3<pbrt::Point3,_float>.z =
                 -local_d0.o.super_Tuple3<pbrt::Point3,_float>.z;
            (local_80->d).super_Tuple3<pbrt::Vector3,_float>.x =
                 local_d0.d.super_Tuple3<pbrt::Vector3,_float>.x;
            (local_80->d).super_Tuple3<pbrt::Vector3,_float>.y =
                 local_d0.d.super_Tuple3<pbrt::Vector3,_float>.y;
            (local_80->d).super_Tuple3<pbrt::Vector3,_float>.z =
                 -local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z;
            local_80->time = local_d0.time;
            (local_80->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = 0;
          }
          return (Float)local_a8._0_4_;
        }
        pLVar1 = (this->elementInterfaces).ptr;
        uVar5 = uVar2 & 0x7fffffff;
        local_e4 = local_e4 - pLVar1[uVar5].thickness;
        local_90.x = 0.0;
        local_90.y = 0.0;
        local_90.z = 0.0;
        fVar8 = pLVar1[uVar5].curvatureRadius;
        if ((fVar8 != 0.0) || (NAN(fVar8))) {
          bVar3 = IntersectSphericalElement
                            (fVar8,local_e4 + fVar8,&local_d0,&t,(Normal3f *)&local_90);
          if (!bVar3) {
            return 0.0;
          }
          auVar10 = ZEXT464((uint)t);
        }
        else {
          t = (local_e4 - local_d0.o.super_Tuple3<pbrt::Point3,_float>.z) /
              local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar10 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),t));
          if (t < 0.0) {
            return 0.0;
          }
        }
        auVar12 = auVar10._8_56_;
        PVar15 = Ray::operator()(&local_d0,auVar10._0_4_);
        fVar13 = PVar15.super_Tuple3<pbrt::Point3,_float>.z;
        auVar10._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar10._8_56_ = auVar12;
        fVar6 = PVar15.super_Tuple3<pbrt::Point3,_float>.x;
        auVar9 = auVar10._0_16_;
        if ((((fVar8 != 0.0) || (NAN(fVar8))) ||
            ((this->apertureImage).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1)) ||
           ((this->apertureImage).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) break;
        auVar14 = vmovshdup_avx(auVar9);
        local_a8 = vinsertps_avx(ZEXT416((uint)((fVar6 / pLVar1[uVar5].apertureRadius + 1.0) * 0.5))
                                 ,ZEXT416((uint)(1.0 - (auVar14._0_4_ / pLVar1[uVar5].apertureRadius
                                                       + 1.0) * 0.5)),0x10);
        local_48 = auVar9;
        WrapMode2D::WrapMode2D(&local_50,Black);
        FVar7 = Image::BilerpChannel(local_78,(Point2f)local_a8._0_8_,0,local_50);
        local_a8._0_4_ = FVar7;
        if ((FVar7 == 0.0) && (!NAN(FVar7))) {
          return 0.0;
        }
        local_d0.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(local_48);
        local_d0.o.super_Tuple3<pbrt::Point3,_float>.z = fVar13;
      }
      auVar14._0_4_ = fVar6 * fVar6;
      auVar14._4_4_ =
           PVar15.super_Tuple3<pbrt::Point3,_float>.y * PVar15.super_Tuple3<pbrt::Point3,_float>.y;
      auVar14._8_4_ = auVar12._0_4_ * auVar12._0_4_;
      auVar14._12_4_ = auVar12._4_4_ * auVar12._4_4_;
      auVar14 = vmovshdup_avx(auVar14);
      auVar14 = vfmadd231ss_fma(auVar14,auVar9,auVar9);
      if (pLVar1[uVar5].apertureRadius * pLVar1[uVar5].apertureRadius < auVar14._0_4_) {
        return 0.0;
      }
      local_d0.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar9);
    } while ((fVar8 == 0.0) &&
            (local_d0.o.super_Tuple3<pbrt::Point3,_float>.z = fVar13, !NAN(fVar8)));
    local_e0.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
    local_e0.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    local_e0.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    fVar8 = 1.0;
    if (uVar4 != 1) {
      fVar6 = (this->elementInterfaces).ptr[uVar4 - 2].eta;
      if ((fVar6 != 0.0) || (fVar8 = 1.0, NAN(fVar6))) {
        fVar8 = fVar6;
      }
    }
    fVar6 = pLVar1[uVar5].eta;
    local_70.z = -local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar9._0_8_ = local_d0.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
    auVar9._8_4_ = 0x80000000;
    auVar9._12_4_ = 0x80000000;
    auVar12 = ZEXT856(auVar9._8_8_);
    local_70._0_8_ = vmovlps_avx(auVar9);
    local_d0.o.super_Tuple3<pbrt::Point3,_float>.z = fVar13;
    VVar16 = Normalize<float>((Vector3<float> *)&local_70);
    local_60.z = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar11._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar11._8_56_ = auVar12;
    local_60._0_8_ = vmovlps_avx(auVar11._0_16_);
    bVar3 = Refract((Vector3f *)&local_60,(Normal3f *)&local_90,fVar8 / fVar6,&local_e0);
    if (!bVar3) break;
    local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z = local_e0.super_Tuple3<pbrt::Vector3,_float>.z;
    local_d0.d.super_Tuple3<pbrt::Vector3,_float>.x = local_e0.super_Tuple3<pbrt::Vector3,_float>.x;
    local_d0.d.super_Tuple3<pbrt::Vector3,_float>.y = local_e0.super_Tuple3<pbrt::Vector3,_float>.y;
  }
  return 0.0;
}

Assistant:

Float RealisticCamera::TraceLensesFromFilm(const Ray &rCamera, Ray *rOut) const {
    Float elementZ = 0, weight = 1;
    // Transform _rCamera_ from camera to lens system space
    Ray rLens(Point3f(rCamera.o.x, rCamera.o.y, -rCamera.o.z),
              Vector3f(rCamera.d.x, rCamera.d.y, -rCamera.d.z), rCamera.time);

    for (int i = elementInterfaces.size() - 1; i >= 0; --i) {
        const LensElementInterface &element = elementInterfaces[i];
        // Update ray from film accounting for interaction with _element_
        elementZ -= element.thickness;
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        bool isStop = (element.curvatureRadius == 0);
        if (isStop) {
            // Compute _t_ at plane of aperture stop
            t = (elementZ - rLens.o.z) / rLens.d.z;
            if (t < 0)
                return 0;

        } else {
            // Intersect ray with element to compute _t_ and _n_
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, rLens, &t, &n))
                return 0;
        }
        DCHECK_GE(t, 0);

        // Test intersection point against element aperture
        Point3f pHit = rLens(t);
        if (isStop && apertureImage) {
            // Check intersection point against _apertureImage_
            Point2f uv((pHit.x / element.apertureRadius + 1) / 2,
                       (pHit.y / element.apertureRadius + 1) / 2);
            uv.y = 1 - uv.y;
            weight = apertureImage.BilerpChannel(uv, 0, WrapMode::Black);
            if (weight == 0)
                return 0;

        } else {
            // Check intersection point against spherical aperture
            Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
            if (r2 > element.apertureRadius * element.apertureRadius)
                return 0;
        }
        rLens.o = pHit;

        // Update ray path for element interface interaction
        if (!isStop) {
            Vector3f w;
            Float eta_i = element.eta;
            Float eta_t = (i > 0 && elementInterfaces[i - 1].eta != 0)
                              ? elementInterfaces[i - 1].eta
                              : 1;
            if (!Refract(Normalize(-rLens.d), n, eta_t / eta_i, &w))
                return 0;
            rLens.d = w;
        }
    }
    // Transform _rLens_ from lens system space back to camera space
    if (rOut != nullptr)
        *rOut = Ray(Point3f(rLens.o.x, rLens.o.y, -rLens.o.z),
                    Vector3f(rLens.d.x, rLens.d.y, -rLens.d.z), rLens.time);

    return weight;
}